

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

char * read_string(char **memory,size_t *length)

{
  void *pvVar1;
  int *piVar2;
  char *local_30;
  char *ret;
  size_t *psStack_20;
  int16_t string_length;
  size_t *length_local;
  char **memory_local;
  
  local_30 = (char *)0x0;
  psStack_20 = length;
  length_local = (size_t *)memory;
  if (1 < *length) {
    pvVar1 = swapped_memscan((void *)((long)&ret + 6),*memory,2);
    *length_local = (size_t)pvVar1;
    *psStack_20 = *psStack_20 - 2;
    if ((-1 < ret._6_2_) && ((ulong)(long)ret._6_2_ <= *psStack_20)) {
      local_30 = (char *)malloc((long)(ret._6_2_ + 1));
      if (local_30 == (char *)0x0) {
        piVar2 = __errno_location();
        *piVar2 = -2;
      }
      else if ((ulong)(long)ret._6_2_ <= *psStack_20) {
        pvVar1 = memscan(local_30,(void *)*length_local,(long)ret._6_2_);
        *length_local = (size_t)pvVar1;
        *psStack_20 = *psStack_20 - (long)ret._6_2_;
        local_30[ret._6_2_] = '\0';
        return local_30;
      }
    }
  }
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    piVar2 = __errno_location();
    *piVar2 = -1;
  }
  free(local_30);
  return (char *)0x0;
}

Assistant:

static char* read_string(const char** memory, size_t* length)
{
    int16_t string_length;
    char* ret = NULL;

    READ_GENERIC(&string_length, sizeof string_length, swapped_memscan, goto parse_error);

    if(string_length < 0)               goto parse_error;
    if(*length < (size_t)string_length) goto parse_error;

    CHECKED_MALLOC(ret, string_length + 1, goto parse_error);

    READ_GENERIC(ret, (size_t)string_length, memscan, goto parse_error);

    ret[string_length] = '\0'; /* don't forget to NULL-terminate ;) */
    return ret;

parse_error:
    if(errno == NBT_OK)
        errno = NBT_ERR;

    free(ret);
    return NULL;
}